

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall cmFindCommon::SelectDefaultSearchModes(cmFindCommon *this)

{
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar1;
  bool bVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  cmValue def;
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
  search_paths;
  cmValue local_118;
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
  local_110;
  
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[33],_true>
            (local_110._M_elems,&this->NoPackageRootPath,
             (char (*) [33])"CMAKE_FIND_USE_PACKAGE_ROOT_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[26],_true>
            (local_110._M_elems + 1,&this->NoCMakePath,(char (*) [26])"CMAKE_FIND_USE_CMAKE_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[38],_true>
            (local_110._M_elems + 2,&this->NoCMakeEnvironmentPath,
             (char (*) [38])"CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[39],_true>
            (local_110._M_elems + 3,&this->NoSystemEnvironmentPath,
             (char (*) [39])"CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[33],_true>
            (local_110._M_elems + 4,&this->NoCMakeSystemPath,
             (char (*) [33])"CMAKE_FIND_USE_CMAKE_SYSTEM_PATH");
  std::
  pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  pair<const_char_(&)[30],_true>
            (local_110._M_elems + 5,&this->NoCMakeInstallPath,
             (char (*) [30])"CMAKE_FIND_USE_INSTALL_PREFIX");
  ppVar1 = local_110._M_elems;
  for (lVar3 = 0xf0; name = &ppVar1->second, lVar3 != 0; lVar3 = lVar3 + -0x28) {
    local_118 = cmMakefile::GetDefinition(this->Makefile,name);
    if (local_118.Value != (string *)0x0) {
      bVar2 = cmValue::IsOn(&local_118);
      *(bool *)*(undefined8 *)((long)(name + -1) + 0x18) = !bVar2;
    }
    ppVar1 = (pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(name + 1);
  }
  std::
  array<std::pair<bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_6UL>
  ::~array(&local_110);
  return;
}

Assistant:

void cmFindCommon::SelectDefaultSearchModes()
{
  const std::array<std::pair<bool&, std::string>, 6> search_paths = {
    { { this->NoPackageRootPath, "CMAKE_FIND_USE_PACKAGE_ROOT_PATH" },
      { this->NoCMakePath, "CMAKE_FIND_USE_CMAKE_PATH" },
      { this->NoCMakeEnvironmentPath,
        "CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH" },
      { this->NoSystemEnvironmentPath,
        "CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH" },
      { this->NoCMakeSystemPath, "CMAKE_FIND_USE_CMAKE_SYSTEM_PATH" },
      { this->NoCMakeInstallPath, "CMAKE_FIND_USE_INSTALL_PREFIX" } }
  };

  for (auto const& path : search_paths) {
    cmValue def = this->Makefile->GetDefinition(path.second);
    if (def) {
      path.first = !def.IsOn();
    }
  }
}